

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::GetReservedAttributesForElement
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *xml_element)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 *array;
  GTestLog local_14;
  
  bVar1 = std::operator==(xml_element,"testsuites");
  if (bVar1) {
    ArrayAsVector<8>(__return_storage_ptr__,(char *(*) [8])kReservedTestSuitesAttributes);
  }
  else {
    bVar1 = std::operator==(xml_element,"testsuite");
    if (bVar1) {
      array = kReservedTestSuiteAttributes;
    }
    else {
      bVar1 = std::operator==(xml_element,"testcase");
      if (!bVar1) {
        internal::GTestLog::GTestLog
                  (&local_14,GTEST_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/external/googletest/googletest/src/gtest.cc"
                   ,0x849);
        poVar2 = std::operator<<((ostream *)&std::cerr,"Condition false failed. ");
        poVar2 = std::operator<<(poVar2,"Unrecognized xml_element provided: ");
        std::operator<<(poVar2,(string *)xml_element);
        internal::GTestLog::~GTestLog(&local_14);
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      array = kReservedTestCaseAttributes;
    }
    ArrayAsVector<6>(__return_storage_ptr__,(char *(*) [6])array);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> GetReservedAttributesForElement(
    const std::string& xml_element) {
  if (xml_element == "testsuites") {
    return ArrayAsVector(kReservedTestSuitesAttributes);
  } else if (xml_element == "testsuite") {
    return ArrayAsVector(kReservedTestSuiteAttributes);
  } else if (xml_element == "testcase") {
    return ArrayAsVector(kReservedTestCaseAttributes);
  } else {
    GTEST_CHECK_(false) << "Unrecognized xml_element provided: " << xml_element;
  }
  // This code is unreachable but some compilers may not realizes that.
  return std::vector<std::string>();
}